

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

GenericValue * __thiscall cereal::JSONInputArchive::Iterator::value(Iterator *this)

{
  Exception *pEVar1;
  Reference pVVar2;
  Iterator *this_local;
  
  if (this->itsSize <= this->itsIndex) {
    pEVar1 = (Exception *)__cxa_allocate_exception(0x10);
    Exception::Exception(pEVar1,"No more objects in input");
    __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
  }
  if (this->itsType == Value) {
    this_local = (Iterator *)(this->itsValueItBegin + this->itsIndex);
  }
  else {
    if (this->itsType != Member) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception
                (pEVar1,
                 "JSONInputArchive internal error: null or empty iterator to object or array!");
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
    pVVar2 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](&this->itsMemberItBegin,this->itsIndex);
    this_local = (Iterator *)&pVVar2->value;
  }
  return (GenericValue *)this_local;
}

Assistant:

GenericValue const & value()
          {
            if( itsIndex >= itsSize )
              throw cereal::Exception("No more objects in input");

            switch(itsType)
            {
              case Value : return itsValueItBegin[itsIndex];
              case Member: return itsMemberItBegin[itsIndex].value;
              default: throw cereal::Exception("JSONInputArchive internal error: null or empty iterator to object or array!");
            }
          }